

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringTest.cpp
# Opt level: O0

void __thiscall
TEST_GlobalSimpleStringMemoryAccountant_reportUseCaches_TestShell::
~TEST_GlobalSimpleStringMemoryAccountant_reportUseCaches_TestShell
          (TEST_GlobalSimpleStringMemoryAccountant_reportUseCaches_TestShell *this)

{
  TEST_GlobalSimpleStringMemoryAccountant_reportUseCaches_TestShell *this_local;
  
  ~TEST_GlobalSimpleStringMemoryAccountant_reportUseCaches_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(GlobalSimpleStringMemoryAccountant, reportUseCaches)
{
    size_t caches[] = {32};
    accountant.useCacheSizes(caches, 1);
    SimpleString str;
    accountant.start();
    str += "More";
    accountant.stop();
    STRCMP_CONTAINS("32                   1                1                 1", accountant.report().asCharString());
}